

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Nsf_Emu::init_sound(Nsf_Emu *this)

{
  byte bVar1;
  Nes_Namco_Apu *this_00;
  Nes_Vrc6_Apu *pNVar2;
  Nes_Fme7_Apu *this_01;
  char *pcVar3;
  double local_20;
  
  bVar1 = (this->header_).chip_flags;
  if ((bVar1 & 0xce) != 0) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ =
         "Uses unsupported audio expansion hardware";
  }
  (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 5;
  (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound::apu_names;
  (this->super_Classic_Emu).voice_types = init_sound::types;
  if ((bVar1 & 0x31) != 0) {
    (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
  }
  local_20 = (this->super_Classic_Emu).super_Music_Emu.gain_;
  if ((bVar1 & 0x10) == 0) {
LAB_006e2508:
    if ((bVar1 & 1) != 0) {
      pNVar2 = (Nes_Vrc6_Apu *)malloc(0x5c8);
      if (pNVar2 == (Nes_Vrc6_Apu *)0x0) {
        this->vrc6 = (Nes_Vrc6_Apu *)0x0;
        goto LAB_006e26e3;
      }
      Nes_Vrc6_Apu::Nes_Vrc6_Apu(pNVar2);
      this->vrc6 = pNVar2;
      local_20 = local_20 * 0.75;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
      bVar1 = (this->header_).chip_flags;
      if ((bVar1 & 0x10) != 0) {
        (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 0x10;
        (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
      }
    }
    if ((bVar1 & 0x20) != 0) {
      this_01 = (Nes_Fme7_Apu *)malloc(0x380);
      if (this_01 == (Nes_Fme7_Apu *)0x0) {
        this->fme7 = (Nes_Fme7_Apu *)0x0;
        goto LAB_006e26e3;
      }
      Blip_Synth_::Blip_Synth_(&(this_01->synth).impl,(this_01->synth).impulses,0xc);
      this_01->oscs[0].output = (Blip_Buffer *)0x0;
      this_01->oscs[1].output = (Blip_Buffer *)0x0;
      this_01->oscs[2].output = (Blip_Buffer *)0x0;
      Blip_Synth_::volume_unit(&(this_01->synth).impl,0.001979166666666667);
      Nes_Fme7_Apu::reset(this_01);
      local_20 = local_20 * 0.75;
      this->fme7 = this_01;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
    }
    if (this->namco != (Nes_Namco_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(this->namco->synth).impl,local_20 * 0.0008333333333333334);
    }
    pNVar2 = this->vrc6;
    if (pNVar2 != (Nes_Vrc6_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(pNVar2->saw_synth).impl,local_20 * 0.006238709677419354);
      Blip_Synth_::volume_unit(&(pNVar2->square_synth).impl,local_20 * 0.0064466666666666665);
    }
    if (this->fme7 != (Nes_Fme7_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(this->fme7->synth).impl,local_20 * 0.001979166666666667);
    }
    Nes_Apu::volume(&this->apu,local_20);
    pcVar3 = (blargg_err_t)0x0;
  }
  else {
    this_00 = (Nes_Namco_Apu *)malloc(0x478);
    if (this_00 != (Nes_Namco_Apu *)0x0) {
      Nes_Namco_Apu::Nes_Namco_Apu(this_00);
      this->namco = this_00;
      local_20 = local_20 * 0.75;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 0xd;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound::names;
      bVar1 = (this->header_).chip_flags;
      goto LAB_006e2508;
    }
    this->namco = (Nes_Namco_Apu *)0x0;
LAB_006e26e3:
    pcVar3 = "Out of memory";
  }
  return pcVar3;
}

Assistant:

blargg_err_t Nsf_Emu::init_sound()
{
	if ( header_.chip_flags & ~(namco_flag | vrc6_flag | fme7_flag) )
		set_warning( "Uses unsupported audio expansion hardware" );
	
	{
		#define APU_NAMES "Square 1", "Square 2", "Triangle", "Noise", "DMC"
		
		int const count = Nes_Apu::osc_count;
		static const char* const apu_names [count] = { APU_NAMES };
		set_voice_count( count );
		set_voice_names( apu_names );
		
	}
	
	static int const types [] = {
		wave_type  | 1, wave_type  | 2, wave_type | 0,
		noise_type | 0, mixed_type | 1,
		wave_type  | 3, wave_type  | 4, wave_type | 5,
		wave_type  | 6, wave_type  | 7, wave_type | 8, wave_type | 9,
		wave_type  |10, wave_type  |11, wave_type |12, wave_type |13
	};
	set_voice_types( types ); // common to all sound chip configurations
	
	double adjusted_gain = gain();
	
	#if NSF_EMU_APU_ONLY
	{
		if ( header_.chip_flags )
			set_warning( "Uses unsupported audio expansion hardware" );
	}
	#else
	{
		if ( header_.chip_flags & (namco_flag | vrc6_flag | fme7_flag) )
			set_voice_count( Nes_Apu::osc_count + 3 );
		
		if ( header_.chip_flags & namco_flag )
		{
			namco = BLARGG_NEW Nes_Namco_Apu;
			CHECK_ALLOC( namco );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Namco_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Wave 1", "Wave 2", "Wave 3", "Wave 4",
				"Wave 5", "Wave 6", "Wave 7", "Wave 8"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( header_.chip_flags & vrc6_flag )
		{
			vrc6 = BLARGG_NEW Nes_Vrc6_Apu;
			CHECK_ALLOC( vrc6 );
			adjusted_gain *= 0.75;
			
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
			
			if ( header_.chip_flags & namco_flag )
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count +
						Nes_Namco_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4",
					"Wave 1", "Wave 2", "Wave 3", "Wave 4",
					"Wave 5", "Wave 6", "Wave 7", "Wave 8"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
		}
		
		if ( header_.chip_flags & fme7_flag )
		{
			fme7 = BLARGG_NEW Nes_Fme7_Apu;
			CHECK_ALLOC( fme7 );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Fme7_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Square 3", "Square 4", "Square 5"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( namco ) namco->volume( adjusted_gain );
		if ( vrc6  ) vrc6 ->volume( adjusted_gain );
		if ( fme7  ) fme7 ->volume( adjusted_gain );
	}
	#endif
	
	apu.volume( adjusted_gain );
	
	return 0;
}